

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

ply_type gvr::anon_unknown_3::PLYProperty::name2Type(string *name)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), bVar1)) {
    return ply_int8;
  }
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), bVar1)) {
    return ply_uint8;
  }
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), bVar1)) {
    return ply_int16;
  }
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), bVar1)) {
    return ply_uint16;
  }
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), bVar1)) {
    return ply_int32;
  }
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), bVar1)) {
    return ply_uint32;
  }
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if ((bVar1) || (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), bVar1)) {
    return ply_float32;
  }
  bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8);
  if ((!bVar1) && (bVar1 = std::operator==(in_RDI,in_stack_ffffffffffffffe8), !bVar1)) {
    return ply_none;
  }
  return ply_float64;
}

Assistant:

ply_type PLYProperty::name2Type(const std::string &name)
{
  if (name == "int8" || name == "char")
  {
    return ply_int8;
  }
  else if (name == "uint8" || name == "uchar")
  {
    return ply_uint8;
  }
  else if (name == "int16" || name == "short")
  {
    return ply_int16;
  }
  else if (name == "uint16" || name == "ushort")
  {
    return ply_uint16;
  }
  else if (name == "int32" || name == "int")
  {
    return ply_int32;
  }
  else if (name == "uint32" || name == "uint")
  {
    return ply_uint32;
  }
  else if (name == "float32" || name == "float")
  {
    return ply_float32;
  }
  else if (name == "float64" || name == "double")
  {
    return ply_float64;
  }

  assert(false);

  return ply_none;
}